

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::search_finish(search *sch)

{
  search_private *priv;
  v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *pvVar1;
  action_repr *paVar2;
  _func_void_void_ptr *delete_label;
  example *peVar3;
  _func_void_search_ptr *p_Var4;
  undefined **ppuVar5;
  ostream *poVar6;
  action_repr *ar;
  long lVar7;
  action_repr *paVar8;
  size_t i;
  ulong uVar9;
  example *ec;
  
  priv = sch->priv;
  clear_cache_hash_map(priv);
  if (priv->truth_string != (stringstream *)0x0) {
    (**(code **)(*(long *)priv->truth_string + 8))();
  }
  if (priv->pred_string != (stringstream *)0x0) {
    (**(code **)(*(long *)priv->pred_string + 8))();
  }
  if (priv->bad_string_stream != (stringstream *)0x0) {
    (**(code **)(*(long *)priv->bad_string_stream + 8))();
  }
  v_array<v_hashmap<unsigned_char_*,_Search::scored_action>::hash_elem>::delete_v
            (&(priv->cache_hash_map).dat);
  std::__cxx11::string::~string((string *)&priv->rawOutputString);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(priv->test_action_sequence).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::__cxx11::stringstream::~stringstream((stringstream *)&priv->dat_new_feature_audit_ss);
  v_array<int>::delete_v(&priv->neighbor_features);
  v_array<unsigned_long>::delete_v(&priv->timesteps);
  if (priv->cb_learner == true) {
    v_array<CB::cb_class>::delete_v((v_array<CB::cb_class> *)&(priv->learn_losses).simple);
  }
  else {
    v_array<COST_SENSITIVE::wclass>::delete_v
              ((v_array<COST_SENSITIVE::wclass> *)&(priv->learn_losses).simple);
  }
  if (priv->cb_learner == true) {
    v_array<CB::cb_class>::delete_v((v_array<CB::cb_class> *)&(priv->gte_label).simple);
  }
  else {
    v_array<COST_SENSITIVE::wclass>::delete_v
              ((v_array<COST_SENSITIVE::wclass> *)&(priv->gte_label).simple);
  }
  v_array<Search::action_repr>::delete_v(&priv->condition_on_actions);
  v_array<unsigned_int>::delete_v(&priv->learn_allowed_actions);
  v_array<COST_SENSITIVE::wclass>::delete_v(&(priv->ldf_test_label).costs);
  features::delete_v(&priv->last_action_repr);
  v_array<std::pair<float,_unsigned_long>_>::delete_v(&priv->active_uncertainty);
  lVar7 = 0;
  for (uVar9 = 0; pvVar1 = (priv->active_known)._begin,
      uVar9 < (ulong)((long)(priv->active_known)._end - (long)pvVar1 >> 5); uVar9 = uVar9 + 1) {
    v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::delete_v
              ((v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *)
               ((long)&pvVar1->_begin + lVar7));
    lVar7 = lVar7 + 0x20;
  }
  v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::delete_v(&priv->active_known);
  if (priv->cb_learner == false) {
    v_array<COST_SENSITIVE::wclass>::delete_v
              ((v_array<COST_SENSITIVE::wclass> *)&priv->allowed_actions_cache->simple);
  }
  else {
    v_array<CB::cb_class>::delete_v((v_array<CB::cb_class> *)&priv->allowed_actions_cache->simple);
  }
  v_array<Search::scored_action>::delete_v(&priv->train_trajectory);
  paVar2 = (priv->ptag_to_action)._end;
  for (paVar8 = (priv->ptag_to_action)._begin; paVar8 != paVar2; paVar8 = paVar8 + 1) {
    if (paVar8->repr != (features *)0x0) {
      features::delete_v(paVar8->repr);
      operator_delete(paVar8->repr);
    }
  }
  v_array<Search::action_repr>::delete_v(&priv->ptag_to_action);
  clear_memo_foreach_action(priv);
  v_array<v_array<Search::action_cache>_*>::delete_v(&priv->memo_foreach_action);
  if (priv->examples_dont_change == false) {
    if (priv->is_ldf == false) {
      ppuVar5 = &MULTICLASS::mc_label;
    }
    else {
      ppuVar5 = &COST_SENSITIVE::cs_label;
    }
    delete_label = (_func_void_void_ptr *)ppuVar5[4];
    peVar3 = (priv->learn_ec_copy)._end;
    for (ec = (priv->learn_ec_copy)._begin; ec != peVar3; ec = ec + 1) {
      VW::dealloc_example(delete_label,ec,(_func_void_void_ptr *)0x0);
    }
    v_array<example>::delete_v(&priv->learn_ec_copy);
  }
  v_array<char>::delete_v(&priv->learn_condition_on_names);
  v_array<unsigned_int>::delete_v(&priv->learn_condition_on);
  v_array<Search::action_repr>::delete_v(&priv->learn_condition_on_act);
  if (priv->active_csoaa == true) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"search calls to run = ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  p_Var4 = priv->task->finish;
  if (p_Var4 != (_func_void_search_ptr *)0x0) {
    (*p_Var4)(sch);
  }
  if ((priv->metatask != (search_metatask *)0x0) &&
     (p_Var4 = priv->metatask->finish, p_Var4 != (_func_void_search_ptr *)0x0)) {
    (*p_Var4)(sch);
  }
  free(priv->allowed_actions_cache);
  if (priv->rawOutputStringStream != (stringstream *)0x0) {
    (**(code **)(*(long *)priv->rawOutputStringStream + 8))();
  }
  free(sch->priv);
  return;
}

Assistant:

void search_finish(search& sch)
{
  search_private& priv = *sch.priv;
  cdbg << "search_finish" << endl;

  clear_cache_hash_map(priv);

  delete priv.truth_string;
  delete priv.pred_string;
  delete priv.bad_string_stream;
  priv.cache_hash_map.~v_hashmap<unsigned char*, scored_action>();
  priv.rawOutputString.~string();
  priv.test_action_sequence.~vector<action>();
  priv.dat_new_feature_audit_ss.~stringstream();
  priv.neighbor_features.delete_v();
  priv.timesteps.delete_v();
  if (priv.cb_learner)
    priv.learn_losses.cb.costs.delete_v();
  else
    priv.learn_losses.cs.costs.delete_v();
  if (priv.cb_learner)
    priv.gte_label.cb.costs.delete_v();
  else
    priv.gte_label.cs.costs.delete_v();

  priv.condition_on_actions.delete_v();
  priv.learn_allowed_actions.delete_v();
  priv.ldf_test_label.costs.delete_v();
  priv.last_action_repr.delete_v();
  priv.active_uncertainty.delete_v();
  for (size_t i = 0; i < priv.active_known.size(); i++) priv.active_known[i].delete_v();
  priv.active_known.delete_v();

  if (priv.cb_learner)
    priv.allowed_actions_cache->cb.costs.delete_v();
  else
    priv.allowed_actions_cache->cs.costs.delete_v();

  priv.train_trajectory.delete_v();
  for (Search::action_repr& ar : priv.ptag_to_action)
  {
    if (ar.repr != nullptr)
    {
      ar.repr->delete_v();
      delete ar.repr;
      cdbg << "delete_v" << endl;
    }
  }
  priv.ptag_to_action.delete_v();
  clear_memo_foreach_action(priv);
  priv.memo_foreach_action.delete_v();

  // destroy copied examples if we needed them
  if (!priv.examples_dont_change)
  {
    void (*delete_label)(void*) = priv.is_ldf ? CS::cs_label.delete_label : MC::mc_label.delete_label;
    for (example& ec : priv.learn_ec_copy) VW::dealloc_example(delete_label, ec);
    priv.learn_ec_copy.delete_v();
  }
  priv.learn_condition_on_names.delete_v();
  priv.learn_condition_on.delete_v();
  priv.learn_condition_on_act.delete_v();

  if (priv.active_csoaa)
    std::cerr << "search calls to run = " << priv.num_calls_to_run << endl;

  if (priv.task->finish)
    priv.task->finish(sch);
  if (priv.metatask && priv.metatask->finish)
    priv.metatask->finish(sch);

  free(priv.allowed_actions_cache);
  delete priv.rawOutputStringStream;
  free(sch.priv);
}